

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void reclaim_rollback_point_test(void)

{
  fdb_status fVar1;
  char *pcVar2;
  fdb_status s_19;
  fdb_status s_18;
  fdb_status s_17;
  fdb_status s_16;
  fdb_status s_15;
  fdb_status s_14;
  fdb_status s_13;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  char *val;
  char *key;
  fdb_status s_1;
  fdb_status s;
  size_t valuelen_out;
  void *value_out;
  fdb_file_info file_info;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char keybuf [16];
  int ndocs;
  int nheaders;
  int low_seq;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffbb8;
  FILE *pFVar3;
  size_t *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  size_t in_stack_fffffffffffffbe8;
  size_t keylen;
  fdb_file_info *in_stack_fffffffffffffbf0;
  fdb_kvs_handle *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  fdb_kvs_handle **in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  fdb_file_handle *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  void *local_1f0;
  ulong local_1c0;
  size_t local_88;
  char local_78 [20];
  int local_64;
  int local_60;
  uint local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  memleak_start();
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_5c = 0;
  local_60 = 5;
  local_64 = 30000;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_58 = system("rm -rf  staleblktest* > errorlog.txt");
  fVar1 = fdb_open((fdb_file_handle **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
                   ,(char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (fdb_config *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x688);
    reclaim_rollback_point_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x688,"void reclaim_rollback_point_test()");
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffd78,
                       (fdb_kvs_handle **)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       in_stack_fffffffffffffd68,
                       (fdb_kvs_config *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x68a);
    reclaim_rollback_point_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x68a,"void reclaim_rollback_point_test()");
  }
  for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
    sprintf(local_78,"key%d",(ulong)local_54);
    strlen(local_78);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
                       ,(void *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (size_t)in_stack_fffffffffffffbd8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar3 = _stderr;
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x693);
      reclaim_rollback_point_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x693,"void reclaim_rollback_point_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbb8,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x696);
    reclaim_rollback_point_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x696,"void reclaim_rollback_point_test()");
  }
  local_5c = local_54;
  local_54 = 0;
  do {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
                       ,(void *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (size_t)in_stack_fffffffffffffbd8);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x69d);
      reclaim_rollback_point_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x69d,"void reclaim_rollback_point_test()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0
                             );
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x6a0);
      reclaim_rollback_point_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6a0,"void reclaim_rollback_point_test()");
    }
  } while (local_1c0 < 0x1000001);
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbb8,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x6a4);
    reclaim_rollback_point_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6a4,"void reclaim_rollback_point_test()");
  }
  for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
    sprintf(local_78,"key%d",(ulong)local_54);
    strlen(local_78);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
                       ,(void *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (size_t)in_stack_fffffffffffffbd8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar3 = _stderr;
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x6aa);
      reclaim_rollback_point_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6aa,"void reclaim_rollback_point_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbb8,'\0');
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x6ad);
    reclaim_rollback_point_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6ad,"void reclaim_rollback_point_test()");
  }
  fVar1 = fdb_rollback(in_stack_fffffffffffffce8,
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  pFVar3 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x6b1);
    reclaim_rollback_point_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6b1,"void reclaim_rollback_point_test()");
  }
  for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
    sprintf(local_78,"key%d",(ulong)local_54);
    strlen(local_78);
    fVar1 = fdb_get_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
                       ,(void **)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x6b7);
      reclaim_rollback_point_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6b7,"void reclaim_rollback_point_test()");
    }
    free(local_1f0);
  }
  local_54 = 0;
  while( true ) {
    if (local_60 <= (int)local_54) {
      for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
        strlen("key");
        strlen("val");
        fVar1 = fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                           in_stack_fffffffffffffbe8,
                           (void *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                           (size_t)in_stack_fffffffffffffbd8);
        pFVar3 = _stderr;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pcVar2 = fdb_error_msg(fVar1);
          fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6c8);
          reclaim_rollback_point_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x6c8,"void reclaim_rollback_point_test()");
        }
      }
      fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbb8,'\0');
      pFVar3 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar2 = fdb_error_msg(fVar1);
        fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6cb);
        reclaim_rollback_point_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6cb,"void reclaim_rollback_point_test()");
      }
      for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
        strlen("key");
        strlen("val");
        fVar1 = fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                           in_stack_fffffffffffffbe8,
                           (void *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                           (size_t)in_stack_fffffffffffffbd8);
        pFVar3 = _stderr;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pcVar2 = fdb_error_msg(fVar1);
          fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6d0);
          reclaim_rollback_point_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x6d0,"void reclaim_rollback_point_test()");
        }
      }
      fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbb8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pFVar3 = _stderr;
        pcVar2 = fdb_error_msg(fVar1);
        fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6d3);
        reclaim_rollback_point_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6d3,"void reclaim_rollback_point_test()");
      }
      for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
        sprintf(local_78,"key%d",(ulong)local_54);
        pcVar2 = local_78;
        keylen = local_88;
        strlen(local_78);
        fVar1 = fdb_get_kv(in_stack_fffffffffffffbf8,pcVar2,keylen,
                           (void **)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                           in_stack_fffffffffffffbd8);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pFVar3 = _stderr;
          pcVar2 = fdb_error_msg(fVar1);
          fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x6d9);
          reclaim_rollback_point_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x6d9,"void reclaim_rollback_point_test()");
        }
        free(local_1f0);
      }
      fVar1 = fdb_kvs_close(in_stack_fffffffffffffbb8);
      pFVar3 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar2 = fdb_error_msg(fVar1);
        fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6de);
        reclaim_rollback_point_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6de,"void reclaim_rollback_point_test()");
      }
      fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffbb8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pFVar3 = _stderr;
        pcVar2 = fdb_error_msg(fVar1);
        fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6e0);
        reclaim_rollback_point_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x6e0,"void reclaim_rollback_point_test()");
      }
      fdb_shutdown();
      memleak_end();
      if (reclaim_rollback_point_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","reclaim rollback point test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","reclaim rollback point test");
      }
      return;
    }
    sprintf(local_78,"key%d",(ulong)local_54);
    strlen(local_78);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
                       ,(void *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (size_t)in_stack_fffffffffffffbd8);
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x6bf);
      reclaim_rollback_point_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x6bf,"void reclaim_rollback_point_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffbb8,'\0');
    pFVar3 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    local_54 = local_54 + 1;
  }
  pcVar2 = fdb_error_msg(fVar1);
  fprintf(pFVar3,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x6c1);
  reclaim_rollback_point_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x6c1,"void reclaim_rollback_point_test()");
}

Assistant:

void reclaim_rollback_point_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=5;
    int ndocs=30000;
    char keybuf[16];

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    void *value_out;
    size_t valuelen_out;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load n docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // overwrite n docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu2", 5);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // rollback to the first commit
    status = fdb_rollback(&db, low_seq);
    TEST_STATUS(status);

    // retrieve docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value_out, &valuelen_out);
        TEST_STATUS(status);
        free(value_out);
    }

    // create nheaders
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // append some data & commit
    // now old blocks will be reclaimed
    for (i=0; i<ndocs; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // append more data .. now reusable blocks are overwritten
    for (i=0; i<ndocs; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // retrieve docs
    for (i=0; i<ndocs; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value_out, &valuelen_out);
        TEST_STATUS(status);
        free(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("reclaim rollback point test");
}